

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer1.cpp
# Opt level: O1

void produce(int n)

{
  int iVar1;
  int *piVar2;
  pthread_t pVar3;
  ostream *this;
  long *plVar4;
  _Storage<int,_true> _Var5;
  undefined1 local_40 [8];
  long local_38;
  
  if (0 < n) {
    _Var5._M_value = 0;
    do {
      local_40._0_4_ = (_Storage<int,_true>)0x0;
      local_40[4] = false;
      local_40._5_3_ = 0;
      local_38 = 100000000;
      do {
        iVar1 = nanosleep((timespec *)local_40,(timespec *)local_40);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Producer (id#",0xd);
      pVar3 = pthread_self();
      if (pVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"thread::id of a non-executing thread",0x24);
        this = (ostream *)&std::cout;
      }
      else {
        this = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      }
      std::__ostream_insert<char,std::char_traits<char>>(this,"): ",3);
      plVar4 = (long *)std::ostream::operator<<((ostream *)this,_Var5._M_value);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      local_40[4] = true;
      local_40._0_4_ = _Var5._M_value;
      rtb::Concurrency::Queue<int>::push(&q,(optional<int> *)local_40);
      _Var5._M_value = _Var5._M_value + 1;
    } while (_Var5._M_value != n);
  }
  local_40[4] = 0;
  rtb::Concurrency::Queue<int>::push(&q,(optional<int> *)local_40);
  return;
}

Assistant:

void produce(int n) {
    for (int i{ 0 }; i < n; ++i) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        cout << "Producer (id#" << std::this_thread::get_id() << "): " << i << endl;
        q.push(i);
    }
    // Notify all the consumers that no more data is going to be pushed on the queue
    q.close();
}